

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O0

void __thiscall Trick::Trick(Trick *this,Trick *obj)

{
  bool bVar1;
  reference __x;
  tuple<int,_Card> *move;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_> *__range1;
  Trick *obj_local;
  Trick *this_local;
  
  std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>::vector
            (&this->m_trick_pile);
  this->m_suit_asked = 3;
  this->m_suit_asked = obj->m_suit_asked;
  this->m_trump_suit = obj->m_trump_suit;
  __end1 = std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>::begin
                     (&obj->m_trick_pile);
  move = (tuple<int,_Card> *)
         std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>::end
                   (&obj->m_trick_pile);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::tuple<int,_Card>_*,_std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>_>
                                *)&move);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_std::tuple<int,_Card>_*,_std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>_>
          ::operator*(&__end1);
    std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>::push_back
              (&this->m_trick_pile,__x);
    __gnu_cxx::
    __normal_iterator<const_std::tuple<int,_Card>_*,_std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

Trick::Trick(const Trick &obj)
{
    m_suit_asked = obj.m_suit_asked;
    m_trump_suit = obj.m_trump_suit;
    for(auto const &move : obj.m_trick_pile) {
        m_trick_pile.push_back(move);
    }
}